

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnRt4AddClampPalCommand::Execute
          (DrawColumnRt4AddClampPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  byte *pbVar12;
  long lVar13;
  uint uVar14;
  
  iVar9 = (this->super_PalRtCommand).yl;
  iVar9 = DrawerThread::count_for_thread(thread,iVar9,((this->super_PalRtCommand).yh - iVar9) + 1);
  if (0 < iVar9) {
    iVar1 = (this->super_PalRtCommand).yl;
    iVar10 = DrawerThread::skipped_by_thread(thread,iVar1);
    iVar2 = (this->super_PalRtCommand).sx;
    iVar1 = (&ylookup)[iVar10 + iVar1];
    puVar4 = (this->super_PalRtCommand)._destorg;
    puVar5 = thread->dc_temp;
    iVar11 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    iVar11 = iVar11 << 2;
    iVar10 = thread->num_cores;
    iVar3 = (this->super_PalRtCommand)._pitch;
    puVar6 = (this->super_PalRtCommand)._colormap;
    puVar7 = (this->super_PalRtCommand)._srcblend;
    puVar8 = (this->super_PalRtCommand)._destblend;
    pbVar12 = puVar4 + (long)(iVar2 + iVar1) + 3;
    lVar13 = 0;
    do {
      uVar14 = puVar8[pbVar12[-3]] + puVar7[puVar6[puVar5[lVar13 * 4 + (long)iVar11]]] & 0x40100400;
      uVar14 = puVar8[pbVar12[-3]] + puVar7[puVar6[puVar5[lVar13 * 4 + (long)iVar11]]] & 0x3e0f83e0
               | 0x1f07c1f | uVar14 - (uVar14 >> 5);
      pbVar12[-3] = RGB32k.All[uVar14 >> 0xf & uVar14];
      uVar14 = puVar8[pbVar12[-2]] + puVar7[puVar6[puVar5[lVar13 * 4 + (long)iVar11 + 1]]] &
               0x40100400;
      uVar14 = puVar8[pbVar12[-2]] + puVar7[puVar6[puVar5[lVar13 * 4 + (long)iVar11 + 1]]] &
               0x3e0f83e0 | 0x1f07c1f | uVar14 - (uVar14 >> 5);
      pbVar12[-2] = RGB32k.All[uVar14 >> 0xf & uVar14];
      uVar14 = puVar8[pbVar12[-1]] + puVar7[puVar6[puVar5[lVar13 * 4 + (long)iVar11 + 2]]] &
               0x40100400;
      uVar14 = puVar8[pbVar12[-1]] + puVar7[puVar6[puVar5[lVar13 * 4 + (long)iVar11 + 2]]] &
               0x3e0f83e0 | 0x1f07c1f | uVar14 - (uVar14 >> 5);
      pbVar12[-1] = RGB32k.All[uVar14 >> 0xf & uVar14];
      uVar14 = puVar8[*pbVar12] + puVar7[puVar6[puVar5[lVar13 * 4 + (long)iVar11 + 3]]] & 0x40100400
      ;
      uVar14 = puVar8[*pbVar12] + puVar7[puVar6[puVar5[lVar13 * 4 + (long)iVar11 + 3]]] & 0x3e0f83e0
               | 0x1f07c1f | uVar14 - (uVar14 >> 5);
      *pbVar12 = RGB32k.All[uVar14 >> 0xf & uVar14];
      lVar13 = lVar13 + 1;
      pbVar12 = pbVar12 + iVar10 * iVar3;
    } while (iVar9 != (int)lVar13);
  }
  return;
}

Assistant:

void DrawColumnRt4AddClampPalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch * thread->num_cores;
		colormap = _colormap;

		const uint32_t *fg2rgb = _srcblend;
		const uint32_t *bg2rgb = _destblend;

		do {
			uint32_t a = fg2rgb[colormap[source[0]]] + bg2rgb[dest[0]];
			uint32_t b = a;

			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			dest[0] = RGB32k.All[(a>>15) & a];

			a = fg2rgb[colormap[source[1]]] + bg2rgb[dest[1]];
			b = a;
			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			dest[1] = RGB32k.All[(a>>15) & a];

			a = fg2rgb[colormap[source[2]]] + bg2rgb[dest[2]];
			b = a;
			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			dest[2] = RGB32k.All[(a>>15) & a];

			a = fg2rgb[colormap[source[3]]] + bg2rgb[dest[3]];
			b = a;
			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			dest[3] = RGB32k.All[(a>>15) & a];

			source += 4;
			dest += pitch;
		} while (--count);
	}